

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O2

void __thiscall cmQtAutoMocUic::cmQtAutoMocUic(cmQtAutoMocUic *this)

{
  cmQtAutoGenerator::cmQtAutoGenerator(&this->super_cmQtAutoGenerator);
  (this->super_cmQtAutoGenerator)._vptr_cmQtAutoGenerator =
       (_func_int **)&PTR__cmQtAutoMocUic_005bba68;
  cmQtAutoGenerator::Logger::Logger(&this->Logger_);
  BaseSettingsT::BaseSettingsT(&this->BaseConst_);
  BaseEvalT::BaseEvalT(&this->BaseEval_);
  MocSettingsT::MocSettingsT(&this->MocConst_);
  MocEvalT::MocEvalT(&this->MocEval_);
  UicSettingsT::UicSettingsT(&this->UicConst_);
  UicEvalT::UicEvalT(&this->UicEval_);
  (this->SettingsFile_)._M_dataplus._M_p = (pointer)&(this->SettingsFile_).field_2;
  (this->SettingsFile_)._M_string_length = 0;
  (this->SettingsFile_).field_2._M_local_buf[0] = '\0';
  (this->SettingsStringMoc_)._M_dataplus._M_p = (pointer)&(this->SettingsStringMoc_).field_2;
  (this->SettingsStringMoc_)._M_string_length = 0;
  (this->SettingsStringMoc_).field_2._M_local_buf[0] = '\0';
  (this->SettingsStringUic_)._M_dataplus._M_p = (pointer)&(this->SettingsStringUic_).field_2;
  (this->SettingsStringUic_)._M_string_length = 0;
  (this->SettingsStringUic_).field_2._M_local_buf[0] = '\0';
  (this->JobError_)._M_base._M_i = false;
  cmWorkerPool::cmWorkerPool(&this->WorkerPool_);
  return;
}

Assistant:

cmQtAutoMocUic::cmQtAutoMocUic() = default;